

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lj_debug_funcname(lua_State *L,cTValue *frame,char **name)

{
  cTValue *nextframe;
  uint uVar1;
  BCReg slot;
  bool bVar2;
  BCPos BVar3;
  char *pcVar4;
  byte bVar6;
  cTValue *pcVar5;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  if (frame <= (cTValue *)(ulong)(L->stack).ptr32) {
    return (char *)0x0;
  }
  lVar8 = 0;
  if (((frame->field_2).it & 7) == 3) {
    lVar8 = -((long)(int)(frame->field_2).it & 0xfffffffffffffff8U);
  }
  nextframe = (cTValue *)((long)frame + lVar8);
  uVar1 = *(uint *)((long)frame + lVar8 + 4);
  if (((long)(int)uVar1 & 3U) == 0) {
    pcVar5 = nextframe + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
  }
  else {
    pcVar5 = (cTValue *)((long)nextframe - ((long)(int)uVar1 & 0xfffffffffffffff8U));
  }
  uVar1 = (pcVar5->u32).lo;
  BVar3 = debug_framepc(L,(GCfunc *)(ulong)uVar1,nextframe);
  if (BVar3 != 0xffffffff) {
    uVar9 = (ulong)(((GCfunc *)(ulong)uVar1)->c).pc.ptr32;
    uVar1 = *(uint *)(uVar9 + (ulong)BVar3 * 4);
    pcVar4 = (char *)((ulong)uVar1 & 0xff);
    uVar7 = (uint)(lj_bc_mode[(long)pcVar4] >> 0xb);
    if (uVar7 == 0x16) {
      bVar2 = true;
    }
    else {
      if (uVar7 == 9) {
        bVar6 = (byte)(uVar1 >> 8);
        slot = bVar6 - 3;
        if ((int)pcVar4 != 0x45) {
          slot = (uint)bVar6;
        }
        pcVar4 = lj_debug_slotname((GCproto *)(uVar9 - 0x40),(BCIns *)(uVar9 + (ulong)BVar3 * 4),
                                   slot,name);
      }
      else {
        *name = (char *)((ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x198 + (ulong)uVar7 * 4) + 0x10
                        );
        pcVar4 = "metamethod";
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_funcname(lua_State *L, cTValue *frame, const char **name)
{
  cTValue *pframe;
  GCfunc *fn;
  BCPos pc;
  if (frame <= tvref(L->stack)+LJ_FR2)
    return NULL;
  if (frame_isvarg(frame))
    frame = frame_prevd(frame);
  pframe = frame_prev(frame);
  fn = frame_func(pframe);
  pc = debug_framepc(L, fn, frame);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    const BCIns *ip = &proto_bc(pt)[check_exp(pc < pt->sizebc, pc)];
    MMS mm = bcmode_mm(bc_op(*ip));
    if (mm == MM_call) {
      BCReg slot = bc_a(*ip);
      if (bc_op(*ip) == BC_ITERC) slot -= 3;
      return lj_debug_slotname(pt, ip, slot, name);
    } else if (mm != MM__MAX) {
      *name = strdata(mmname_str(G(L), mm));
      return "metamethod";
    }
  }
  return NULL;
}